

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

void Hop_ManCreateRefs(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_00;
  int local_1c;
  int i;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  if (p->fRefCount == 0) {
    p->fRefCount = 1;
    pHVar2 = Hop_ManConst1(p);
    Hop_ObjClearRef(pHVar2);
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPis), local_1c < iVar1; local_1c = local_1c + 1) {
      pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(p->vPis,local_1c);
      Hop_ObjClearRef(pHVar2);
    }
    for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
      if (p->pTable[local_1c] != (Hop_Obj_t *)0x0) {
        Hop_ObjClearRef(p->pTable[local_1c]);
      }
    }
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPos), local_1c < iVar1; local_1c = local_1c + 1) {
      pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,local_1c);
      Hop_ObjClearRef(pHVar2);
    }
    for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
      pHVar2 = p->pTable[local_1c];
      if (pHVar2 != (Hop_Obj_t *)0x0) {
        pObj_00 = Hop_ObjFanin0(pHVar2);
        Hop_ObjRef(pObj_00);
        pHVar2 = Hop_ObjFanin1(pHVar2);
        Hop_ObjRef(pHVar2);
      }
    }
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPos), local_1c < iVar1; local_1c = local_1c + 1) {
      pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,local_1c);
      pHVar2 = Hop_ObjFanin0(pHVar2);
      Hop_ObjRef(pHVar2);
    }
  }
  return;
}

Assistant:

void Hop_ManCreateRefs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    if ( p->fRefCount )
        return;
    p->fRefCount = 1;
    // clear refs
    Hop_ObjClearRef( Hop_ManConst1(p) );
    Hop_ManForEachPi( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjClearRef( pObj );
    // set refs
    Hop_ManForEachNode( p, pObj, i )
    {
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
        Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
}